

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP5Serializer::OnetimeMarshalAttribute(BP5Serializer *this,AttributeBase *baseAttr)

{
  DataType Type;
  char *Name;
  long lVar1;
  pointer_____offset_0x10___ *ppuVar2;
  void *Data;
  size_t ElemCount;
  
  Type = baseAttr->m_Type;
  ElemCount = 0xffffffffffffffff;
  if (baseAttr->m_IsSingleValue == false) {
    ElemCount = baseAttr->m_Elements;
  }
  Name = (baseAttr->m_Name)._M_dataplus._M_p;
  switch(Type) {
  case None:
    return;
  case Int8:
    ppuVar2 = &core::Attribute<signed_char>::typeinfo;
    break;
  case Int16:
    ppuVar2 = &core::Attribute<short>::typeinfo;
    break;
  case Int32:
    ppuVar2 = &core::Attribute<int>::typeinfo;
    break;
  case Int64:
    ppuVar2 = &core::Attribute<long>::typeinfo;
    break;
  case UInt8:
    ppuVar2 = &core::Attribute<unsigned_char>::typeinfo;
    break;
  case UInt16:
    ppuVar2 = &core::Attribute<unsigned_short>::typeinfo;
    break;
  case UInt32:
    ppuVar2 = &core::Attribute<unsigned_int>::typeinfo;
    break;
  case UInt64:
    ppuVar2 = &core::Attribute<unsigned_long>::typeinfo;
    break;
  case Float:
    ppuVar2 = &core::Attribute<float>::typeinfo;
    break;
  case Double:
    ppuVar2 = &core::Attribute<double>::typeinfo;
    break;
  case LongDouble:
    lVar1 = __dynamic_cast(baseAttr,&core::AttributeBase::typeinfo,
                           &core::Attribute<long_double>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) != '\0') {
      Data = (void *)(lVar1 + 0x60);
      goto LAB_00626cbd;
    }
    goto LAB_00626cb9;
  case FloatComplex:
    ppuVar2 = &core::Attribute<std::complex<float>>::typeinfo;
    break;
  case DoubleComplex:
    ppuVar2 = &core::Attribute<std::complex<double>>::typeinfo;
    break;
  case String:
    lVar1 = __dynamic_cast(baseAttr,&core::AttributeBase::typeinfo,
                           &core::Attribute<std::__cxx11::string>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) != '\x01') goto LAB_00626cb9;
    goto LAB_00626cb3;
  case Char:
    ppuVar2 = &core::Attribute<char>::typeinfo;
    break;
  default:
    Data = (void *)0x0;
    goto LAB_00626cbd;
  }
  lVar1 = __dynamic_cast(baseAttr,&core::AttributeBase::typeinfo,ppuVar2,0);
  if (*(char *)(lVar1 + 0x38) == '\0') {
LAB_00626cb9:
    Data = *(void **)(lVar1 + 0x40);
  }
  else {
LAB_00626cb3:
    Data = (void *)(lVar1 + 0x58);
  }
LAB_00626cbd:
  OnetimeMarshalAttribute(this,Name,Type,ElemCount,Data);
  return;
}

Assistant:

void BP5Serializer::OnetimeMarshalAttribute(const core::AttributeBase &baseAttr)
{
    const char *Name = baseAttr.m_Name.c_str();
    const DataType Type = baseAttr.m_Type;
    size_t ElemCount = baseAttr.m_Elements;
    const void *Data = nullptr;
    if (baseAttr.m_IsSingleValue)
        ElemCount = (size_t)-1;
    if (Type == DataType::None)
    {
        return;
    }
    else if (Type == helper::GetDataType<std::string>())
    {
        const core::Attribute<std::string> *attribute =
            dynamic_cast<const core::Attribute<std::string> *>(&baseAttr);
        if (attribute->m_IsSingleValue)
        {
            Data = (void *)&attribute->m_DataSingleValue;
        }
        else
        {
            Data = &(attribute->m_DataArray[0]);
        }
    }
#define per_type_code(T)                                                                           \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        const core::Attribute<T> *attribute = dynamic_cast<const core::Attribute<T> *>(&baseAttr); \
        Data = (void *)(&attribute->m_DataSingleValue);                                            \
        if (!attribute->m_IsSingleValue)                                                           \
        {                                                                                          \
            Data = (void *)attribute->m_DataArray.data();                                          \
        }                                                                                          \
    }

    ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(per_type_code)
#undef per_type_code

    OnetimeMarshalAttribute(Name, Type, ElemCount, Data);
}